

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

uint32_t __thiscall
cfd::core::ConfidentialTxOutReference::GetSerializeSize
          (ConfidentialTxOutReference *this,bool is_blinded,uint32_t *witness_area_size,
          uint32_t *no_witness_area_size,int exponent,int minimum_bits,uint32_t *rangeproof_size,
          uint32_t input_asset_count)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  int64_t iVar5;
  CfdException *this_00;
  uint32_t uVar6;
  undefined7 in_register_00000031;
  int64_t amount;
  Script *pSVar7;
  uint32_t uVar8;
  Amount AVar9;
  allocator local_61;
  int local_60;
  int ret;
  undefined1 local_58 [8];
  int local_50;
  char *local_48;
  size_t size;
  
  if (((int)CONCAT71(in_register_00000031,is_blinded) != 0) || ((this->nonce_).version_ != '\0')) {
    pSVar7 = &(this->super_AbstractTxOutReference).locking_script_;
    bVar1 = Script::IsEmpty(pSVar7);
    if ((!bVar1) && (bVar1 = Script::IsPegoutScript(pSVar7), !bVar1)) {
      local_60 = minimum_bits;
      Script::GetData((ByteData *)local_58,pSVar7);
      sVar3 = ByteData::GetSerializeSize((ByteData *)local_58);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
      if (input_asset_count == 0) {
        iVar2 = 0xa3;
      }
      else {
        size = 0;
        ret = wally_asset_surjectionproof_size((ulong)input_asset_count,&size);
        if (ret != 0) {
          local_58 = (undefined1  [8])0x4f4a79;
          local_50 = 0x4b0;
          local_48 = "GetSerializeSize";
          logger::warn<int&>((CfdSourceLocation *)local_58,"wally_asset_surjectionproof_size NG[{}]"
                             ,&ret);
          this_00 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::__cxx11::string::string
                    ((string *)local_58,"calc asset surjectionproof size error.",&local_61);
          CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_58);
          __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
        }
        iVar2 = (int)size + 1;
        ret = 0;
      }
      if ((rangeproof_size == (uint32_t *)0x0) || (uVar6 = *rangeproof_size, uVar6 == 0)) {
        if ((this->confidential_value_).version_ < 2) {
          AVar9 = ConfidentialValue::GetAmount(&this->confidential_value_);
          local_58 = (undefined1  [8])AVar9.amount_;
          local_50 = CONCAT31(local_50._1_3_,AVar9.ignore_check_);
          iVar5 = Amount::GetSatoshiValue((Amount *)local_58);
          amount = 1;
          if ((this->nonce_).version_ == '\0') {
            amount = 2100000000000000;
          }
          if (iVar5 != 0) {
            amount = iVar5;
          }
          uVar6 = CalculateRangeProofSize(amount,exponent,local_60);
          uVar6 = uVar6 + 4;
          if (rangeproof_size != (uint32_t *)0x0) {
            *rangeproof_size = uVar6;
          }
        }
        else {
          sVar4 = ByteData::GetDataSize(&this->range_proof_);
          uVar6 = (int)sVar4 + 4;
        }
      }
      uVar6 = uVar6 + iVar2;
      uVar8 = (int)sVar3 + 99;
      goto LAB_002fa126;
    }
  }
  pSVar7 = &(this->super_AbstractTxOutReference).locking_script_;
  bVar1 = Script::IsEmpty(pSVar7);
  uVar6 = 2;
  if (bVar1) {
    uVar8 = 0x2c;
  }
  else {
    Script::GetData((ByteData *)local_58,pSVar7);
    sVar3 = ByteData::GetSerializeSize((ByteData *)local_58);
    uVar8 = (int)sVar3 + 0x2b;
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  }
LAB_002fa126:
  if (witness_area_size != (uint32_t *)0x0) {
    *witness_area_size = uVar6;
  }
  if (no_witness_area_size != (uint32_t *)0x0) {
    *no_witness_area_size = uVar8;
  }
  return uVar8 + uVar6;
}

Assistant:

uint32_t ConfidentialTxOutReference::GetSerializeSize(
    bool is_blinded, uint32_t *witness_area_size,
    uint32_t *no_witness_area_size, int exponent, int minimum_bits,
    uint32_t *rangeproof_size, uint32_t input_asset_count) const {
  static constexpr const uint32_t kTxOutMaxSurjection = 162 + 1;
  // SECP256K1_SURJECTIONPROOF_SERIALIZATION_BYTES(256, 3) = 162
  // ((n + 7)/8 + 34 + 32m) (m: 1 to 3)
  // n=1:  (1 + 34 + 32) = 67
  // n=2:  (1 + 98) = 99
  // n>=3: ((n + 7)/8 + 130)

  // static constexpr const uint32_t kTxOutRangeproof = 2893 + 3;
  uint32_t result = 0;
  uint32_t witness_size = 0;
  bool is_blind = is_blinded || (!nonce_.IsEmpty());
  if (is_blind && (!locking_script_.IsEmpty()) &&
      (!locking_script_.IsPegoutScript())) {
    result += kConfidentialDataSize;  // asset
    result += kConfidentialDataSize;  // value
    result += kConfidentialDataSize;  // nonce
    result +=
        static_cast<uint32_t>(locking_script_.GetData().GetSerializeSize());

    if (input_asset_count == 0) {
      witness_size += kTxOutMaxSurjection;  // maximum surjection proof
    } else {
      size_t size = 0;
      int ret = wally_asset_surjectionproof_size(input_asset_count, &size);
      if (ret != WALLY_OK) {
        warn(CFD_LOG_SOURCE, "wally_asset_surjectionproof_size NG[{}]", ret);
        throw CfdException(
            kCfdIllegalStateError, "calc asset surjectionproof size error.");
      }
      witness_size += static_cast<uint32_t>(size) + 1;
    }
    // witness_size += kTxOutRangeproof;  // range proof
    uint32_t work_proof_size = 0;
    if ((rangeproof_size != nullptr) && (*rangeproof_size != 0)) {
      work_proof_size = *rangeproof_size;
    } else if (confidential_value_.HasBlinding()) {
      work_proof_size = 4 + static_cast<uint32_t>(range_proof_.GetDataSize());
    } else {
      int64_t amount = confidential_value_.GetAmount().GetSatoshiValue();
      if (amount == 0) amount = (nonce_.IsEmpty()) ? kMaxAmount : 1;
      work_proof_size =
          4 + CalculateRangeProofSize(amount, exponent, minimum_bits);
      if (rangeproof_size != nullptr) *rangeproof_size = work_proof_size;
    }
    witness_size += work_proof_size;
  } else {
    result += kConfidentialDataSize;   // asset
    result += kConfidentialValueSize;  // value
    if (locking_script_.IsEmpty()) {
      result += 2;  // fee (nonce & lockingScript empty.)
    } else {
      result += 1;  // nonce
      result +=
          static_cast<uint32_t>(locking_script_.GetData().GetSerializeSize());
    }
    witness_size += 1;  // surjection proof
    witness_size += 1;  // range proof
  }

  if (witness_area_size != nullptr) {
    *witness_area_size = witness_size;
  }
  if (no_witness_area_size != nullptr) {
    *no_witness_area_size = result;
  }
  result += witness_size;
  return result;
}